

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Spinner.H
# Opt level: O2

void __thiscall Fl_Spinner::update(Fl_Spinner *this)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  char temp [64];
  char s [255];
  undefined8 uStack_160;
  char local_158 [64];
  char local_118 [264];
  
  pcVar2 = this->format_;
  if (((*pcVar2 == '%') && (pcVar2[1] == '.')) && (pcVar2[2] == '*')) {
    uStack_160 = 0x18b7b7;
    sprintf(local_158,"%.12f",this->step_);
    pcVar2 = (char *)((long)&uStack_160 + 6);
    do {
      pcVar1 = pcVar2 + 2;
      pcVar2 = pcVar2 + 1;
    } while (*pcVar1 != '\0');
    do {
      pcVar1 = pcVar2;
      if (pcVar1 <= local_158) break;
      pcVar2 = pcVar1 + -1;
    } while (*pcVar1 == '0');
    uVar3 = 0;
    for (; (local_158 < pcVar1 && ((byte)(*pcVar1 - 0x30U) < 10)); pcVar1 = pcVar1 + -1) {
      uVar3 = (ulong)((int)uVar3 + 1);
    }
    uStack_160 = 0x18b83f;
    sprintf(local_118,this->format_,this->value_,uVar3);
  }
  else {
    uStack_160 = 0x18b805;
    sprintf(local_118,pcVar2,this->value_);
  }
  uStack_160 = 0x18b819;
  Fl_Input_::value(&(this->input_).super_Fl_Input_,local_118);
  return;
}

Assistant:

void		update() {
		  char s[255];		// Value string

		  if (format_[0]=='%'&&format_[1]=='.'&&format_[2]=='*') {  // precision argument
		    // this code block is a simplified version of
		    // Fl_Valuator::format() and works well (but looks ugly)
		    int c = 0;
		    char temp[64], *sp = temp;
		    sprintf(temp, "%.12f", step_);
		    while (*sp) sp++;
		    sp--;
		    while (sp>temp && *sp=='0') sp--;
		    while (sp>temp && (*sp>='0' && *sp<='9')) { sp--; c++; }
		    sprintf(s, format_, c, value_);
		  } else {
		    sprintf(s, format_, value_);
		  }
		  input_.value(s);
		}